

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnownFormats.h
# Opt level: O3

Item * __thiscall
jbcoin::KnownFormats<jbcoin::LedgerEntryType>::findByName
          (KnownFormats<jbcoin::LedgerEntryType> *this,string *name)

{
  const_iterator cVar1;
  Item *pIVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<jbcoin::LedgerEntryType>::Item_*>_>_>
          ::find(&(this->m_names)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_names)._M_t._M_impl.super__Rb_tree_header) {
    pIVar2 = (Item *)0x0;
  }
  else {
    pIVar2 = *(Item **)(cVar1._M_node + 2);
  }
  return pIVar2;
}

Assistant:

Item const* findByName (std::string const& name) const noexcept
    {
        Item* result = nullptr;

        typename NameMap::const_iterator const iter = m_names.find (name);

        if (iter != m_names.end ())
        {
            result = iter->second;
        }

        return result;
    }